

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityData<unsigned_long>::TemplatedValidityData
          (TemplatedValidityData<unsigned_long> *this,unsigned_long *validity_mask,idx_t count)

{
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var1;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> __p;
  tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_> in_RAX;
  idx_t entry_idx;
  ulong uVar2;
  ulong n;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_28;
  
  (this->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false> = (_Head_base<0UL,_unsigned_long_*,_false>)0x0;
  n = count + 0x3f >> 6;
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       in_RAX.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  make_unsafe_uniq_array_uninitialized<unsigned_long>((duckdb *)&local_28,n);
  __p._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       local_28._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  ::std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
            ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)this,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_28);
  _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (this->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
       _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
  for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
    *(unsigned_long *)
     ((long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + uVar2 * 8) =
         validity_mask[uVar2];
  }
  return;
}

Assistant:

inline TemplatedValidityData(const V *validity_mask, idx_t count) {
		D_ASSERT(validity_mask);
		auto entry_count = EntryCount(count);
		owned_data = make_unsafe_uniq_array_uninitialized<V>(entry_count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			owned_data[entry_idx] = validity_mask[entry_idx];
		}
	}